

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O0

void Sfm_NtkPrepare(Sfm_Ntk_t *p)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Vec_Wrd_t *pVVar3;
  Vec_Wec_t *pVVar4;
  sat_solver *psVar5;
  Sfm_Ntk_t *p_local;
  
  iVar1 = Vec_IntFindMax(&p->vLevels);
  p->nLevelMax = iVar1 + p->pPars->nGrowthLevel;
  pVVar2 = Vec_IntAlloc(1000);
  p->vNodes = pVVar2;
  pVVar2 = Vec_IntAlloc(100);
  p->vDivs = pVVar2;
  pVVar2 = Vec_IntAlloc(1000);
  p->vRoots = pVVar2;
  pVVar2 = Vec_IntAlloc(1000);
  p->vTfo = pVVar2;
  pVVar3 = Vec_WrdStart(p->pPars->nWinSizeMax);
  p->vDivCexes = pVVar3;
  pVVar2 = Vec_IntAlloc(100);
  p->vOrder = pVVar2;
  pVVar2 = Vec_IntAlloc(100);
  p->vDivVars = pVVar2;
  pVVar2 = Vec_IntAlloc(1000);
  p->vDivIds = pVVar2;
  pVVar2 = Vec_IntAlloc(100);
  p->vLits = pVVar2;
  pVVar2 = Vec_IntAlloc(100);
  p->vValues = pVVar2;
  pVVar4 = Vec_WecAlloc(100);
  p->vClauses = pVVar4;
  pVVar2 = Vec_IntAlloc(10);
  p->vFaninMap = pVVar2;
  psVar5 = sat_solver_new();
  p->pSat = psVar5;
  sat_solver_setnvars(p->pSat,p->pPars->nWinSizeMax);
  return;
}

Assistant:

void Sfm_NtkPrepare( Sfm_Ntk_t * p )
{
    p->nLevelMax = Vec_IntFindMax(&p->vLevels) + p->pPars->nGrowthLevel;
    p->vNodes    = Vec_IntAlloc( 1000 );
    p->vDivs     = Vec_IntAlloc( 100 );
    p->vRoots    = Vec_IntAlloc( 1000 );
    p->vTfo      = Vec_IntAlloc( 1000 );
    p->vDivCexes = Vec_WrdStart( p->pPars->nWinSizeMax );
    p->vOrder    = Vec_IntAlloc( 100 );
    p->vDivVars  = Vec_IntAlloc( 100 );
    p->vDivIds   = Vec_IntAlloc( 1000 );
    p->vLits     = Vec_IntAlloc( 100 );
    p->vValues   = Vec_IntAlloc( 100 );
    p->vClauses  = Vec_WecAlloc( 100 );
    p->vFaninMap = Vec_IntAlloc( 10 );
    p->pSat      = sat_solver_new();
    sat_solver_setnvars( p->pSat, p->pPars->nWinSizeMax );
}